

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O0

rtaudio_t rtaudio_create(rtaudio_api_t api)

{
  Api api_00;
  rtaudio_t __s;
  RtAudio *this;
  anon_class_8_1_a7a78af6 local_40;
  RtAudioErrorCallback local_38;
  rtaudio_t local_18;
  rtaudio_t audio;
  rtaudio_api_t api_local;
  
  audio._4_4_ = api;
  __s = (rtaudio_t)operator_new(0x220);
  memset(__s,0,0x220);
  __s->errtype = 0;
  local_18 = __s;
  this = (RtAudio *)operator_new(8);
  api_00 = audio._4_4_;
  local_40.audio = local_18;
  std::function<void(RtAudioErrorType,std::__cxx11::string_const&)>::
  function<rtaudio_create::__0,void>
            ((function<void(RtAudioErrorType,std::__cxx11::string_const&)> *)&local_38,&local_40);
  RtAudio::RtAudio(this,api_00,&local_38);
  local_18->audio = this;
  std::
  function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  return local_18;
}

Assistant:

rtaudio_t rtaudio_create(rtaudio_api_t api) {
  rtaudio_t audio = new struct rtaudio();
  audio->errtype = RTAUDIO_ERROR_NONE;
  audio->audio = new RtAudio((RtAudio::Api)api,
    [audio](RtAudioErrorType type, const std::string &errorText){
      audio->errtype = (rtaudio_error_t)type;
      strncpy(audio->errmsg, errorText.c_str(), errorText.size() - 1);
    });
  return audio;
}